

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::source_location_formatter::format
          (source_location_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *__src;
  uint uVar5;
  uint uVar6;
  ptrdiff_t _Num;
  char *buf_ptr_1;
  ulong uVar7;
  char *buf_ptr;
  scoped_pad p;
  scoped_pad sStack_78;
  format_int local_50;
  
  if ((msg->source).line != 0) {
    sVar2 = (this->super_flag_formatter).padinfo_.width_;
    pcVar4 = (msg->source).filename;
    sVar3 = strlen(pcVar4);
    if (sVar2 == 0) {
      if (pcVar4 != (char *)0x0) {
        uVar7 = (dest->super_basic_buffer<char>).size_ + sVar3;
        if ((dest->super_basic_buffer<char>).capacity_ < uVar7) {
          (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar7);
        }
        if (sVar3 != 0) {
          memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,
                  pcVar4,sVar3);
        }
        (dest->super_basic_buffer<char>).size_ = uVar7;
      }
      if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
        (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
      }
      sVar2 = (dest->super_basic_buffer<char>).size_;
      (dest->super_basic_buffer<char>).size_ = sVar2 + 1;
      (dest->super_basic_buffer<char>).ptr_[sVar2] = ':';
      __src = fmt::v5::format_int::format_decimal
                        ((format_int *)&sStack_78,(ulong)(msg->source).line);
      pcVar4 = (char *)((long)&sStack_78.total_pad_ + 5);
      sVar3 = (long)pcVar4 - (long)__src;
      uVar7 = (dest->super_basic_buffer<char>).size_ + sVar3;
      sStack_78.spaces_.data_ = __src;
      if ((dest->super_basic_buffer<char>).capacity_ < uVar7) {
        (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar7);
      }
      if (pcVar4 != __src) {
        memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,__src
                ,sVar3);
      }
      (dest->super_basic_buffer<char>).size_ = uVar7;
    }
    else {
      uVar1 = (msg->source).line;
      uVar5 = uVar1 | 1;
      uVar6 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = (uVar6 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      scoped_pad::scoped_pad
                (&sStack_78,
                 sVar3 + ((uVar6 + 1) -
                         (uint)(uVar1 < *(uint *)(fmt::v5::internal::basic_data<void>::
                                                  ZERO_OR_POWERS_OF_10_32 + (ulong)uVar6 * 4))) + 1,
                 &(this->super_flag_formatter).padinfo_,dest);
      pcVar4 = (msg->source).filename;
      sVar3 = strlen(pcVar4);
      if (pcVar4 != (char *)0x0) {
        uVar7 = (dest->super_basic_buffer<char>).size_ + sVar3;
        if ((dest->super_basic_buffer<char>).capacity_ < uVar7) {
          (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar7);
        }
        if (sVar3 != 0) {
          memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,
                  pcVar4,sVar3);
        }
        (dest->super_basic_buffer<char>).size_ = uVar7;
      }
      if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
        (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
      }
      sVar2 = (dest->super_basic_buffer<char>).size_;
      (dest->super_basic_buffer<char>).size_ = sVar2 + 1;
      (dest->super_basic_buffer<char>).ptr_[sVar2] = ':';
      pcVar4 = fmt::v5::format_int::format_decimal(&local_50,(ulong)(msg->source).line);
      sVar3 = (long)(local_50.buffer_ + 0x15) - (long)pcVar4;
      uVar7 = (dest->super_basic_buffer<char>).size_ + sVar3;
      local_50.str_ = pcVar4;
      if ((dest->super_basic_buffer<char>).capacity_ < uVar7) {
        (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar7);
      }
      if (local_50.buffer_ + 0x15 != pcVar4) {
        memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,
                pcVar4,sVar3);
      }
      (dest->super_basic_buffer<char>).size_ = uVar7;
      scoped_pad::~scoped_pad(&sStack_78);
    }
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        string_view_t field_value{full_days[tm_time.tm_wday]};
        scoped_pad p(field_value, padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }